

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this)

{
  this->nStored = 0;
  pmr::polymorphic_allocator<float>::deallocate_object<float>(&this->alloc,this->ptr,this->nAlloc);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }